

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

Value __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::makeBuiltin
          (Interpreter *this,string *name,Params *params)

{
  bool bVar1;
  _Base_ptr p_Var2;
  anon_union_8_3_4e909c26_for_v extraout_RDX;
  Value VVar3;
  Value v;
  HeapClosure *local_60;
  BindingFrame local_58;
  
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_t._M_impl.super__Rb_tree_header._M_header;
  local_58._M_t._M_impl._0_8_ = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  VVar3._0_8_ = (HeapClosure *)operator_new(0x90);
  HeapClosure::HeapClosure(VVar3._0_8_,&local_58,(HeapObject *)0x0,0,params,(AST *)0x0,name);
  local_60 = VVar3._0_8_;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
  ::push_back(&(this->heap).entities,(value_type *)&local_60);
  ((VVar3._0_8_)->super_HeapEntity).mark = (this->heap).lastMark;
  (this->heap).numEntities =
       (long)(this->heap).entities.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->heap).entities.
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3;
  bVar1 = Heap::checkHeap(&this->heap);
  if (bVar1) {
    Heap::markFrom(&this->heap,(HeapEntity *)VVar3._0_8_);
    Stack::mark(&this->stack,&this->heap);
    v._4_4_ = 0;
    v.t = (this->scratch).t;
    v.v.h = (this->scratch).v.h;
    Heap::markFrom(&this->heap,v);
    for (p_Var2 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if (*(HeapEntity **)(*(long *)(p_Var2 + 3) + 0x40) != (HeapEntity *)0x0) {
        Heap::markFrom(&this->heap,*(HeapEntity **)(*(long *)(p_Var2 + 3) + 0x40));
      }
    }
    for (p_Var2 = (this->sourceVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->sourceVals)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      Heap::markFrom(&this->heap,*(HeapEntity **)(p_Var2 + 2));
    }
    Heap::sweep(&this->heap);
  }
  std::
  map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::~map(&local_58);
  VVar3.v.h = extraout_RDX.h;
  return VVar3;
}

Assistant:

Value makeBuiltin(const std::string &name, const HeapClosure::Params &params)
    {
        AST *body = nullptr;
        Value r;
        r.t = Value::FUNCTION;
        r.v.h = makeHeap<HeapClosure>(BindingFrame(), nullptr, 0, params, body, name);
        return r;
    }